

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg3.c
# Opt level: O3

borg_need borg_maintain_light(void)

{
  byte bVar1;
  borg_item *pbVar2;
  _Bool _Var3;
  borg_need bVar4;
  wchar_t wVar5;
  borg_need bVar6;
  ulong uVar7;
  
  pbVar2 = borg_items;
  uVar7 = (ulong)z_info->pack_size;
  _Var3 = flag_has_dbg(borg_items[uVar7 + 5].flags,5,0x15,"current_light->flags","OF_NO_FUEL");
  bVar4 = BORG_NO_NEED;
  bVar6 = BORG_NO_NEED;
  if (!_Var3) {
    if (pbVar2[uVar7 + 5].tval == '\x13') {
      bVar1 = pbVar2[uVar7 + 5].sval;
      bVar6 = bVar4;
      if (sv_light_torch == (uint)bVar1) {
        if (pbVar2[uVar7 + 5].timeout < 0xfb) {
          wVar5 = borg_slot(L'\x13',(uint)bVar1);
          bVar6 = (uint)wVar5 >> 0x1e & ~BORG_MET_NEED;
        }
      }
      else if ((sv_light_lantern == (uint)bVar1) &&
              (borg_items[(ulong)z_info->pack_size + 5].timeout < 1000)) {
        _Var3 = borg_refuel_lantern();
        bVar6 = BORG_UNMET_NEED - _Var3;
      }
    }
    else {
      wVar5 = borg_slot(L'\x13',sv_light_lantern);
      if ((wVar5 < L'\0') && (wVar5 = borg_slot(L'\x13',sv_light_torch), wVar5 < L'\0')) {
        return BORG_UNMET_NEED;
      }
      borg_keypress(0x77);
      borg_keypress((int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[(uint)wVar5]);
      bVar6 = BORG_MET_NEED;
    }
  }
  return bVar6;
}

Assistant:

enum borg_need borg_maintain_light(void)
{
    int        i;
    borg_item* current_light = &borg_items[INVEN_LIGHT];

    if (of_has(current_light->flags, OF_NO_FUEL))
        return BORG_NO_NEED;

    /*  current torch */
    if (current_light->tval == TV_LIGHT) {
        if (current_light->sval == sv_light_torch) {
            if (current_light->timeout > 250) {
                return BORG_NO_NEED;
            } else {
                /* Look for another torch */
                i = borg_slot(TV_LIGHT, sv_light_torch);
                if (i < 0)
                    return BORG_UNMET_NEED;

                /* Torches automatically disappear when they get to 0 turns
                 * so we don't need to actively swap them out */
                return BORG_NO_NEED;
            }
        }

        /* Refuel current lantern */
        if (current_light->sval == sv_light_lantern) {
            /* Refuel the lantern if needed */
            if (borg_items[INVEN_LIGHT].timeout < 1000) {
                if (borg_refuel_lantern())
                    return BORG_MET_NEED;

                return BORG_UNMET_NEED;
            }
        }
        return BORG_NO_NEED;
    } else {
        i = borg_slot(TV_LIGHT, sv_light_lantern);
        if (i < 0) {
            i = borg_slot(TV_LIGHT, sv_light_torch);
        }

        if (i < 0) {
            return BORG_UNMET_NEED;
        } else {
            borg_keypress('w');
            borg_keypress(all_letters_nohjkl[i]);
            return BORG_MET_NEED;
        }
    }
}